

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

greatest_test_res generic_pack_unpack_be_d_should_match(void)

{
  float fVar1;
  char *greatest_FMT;
  double unpack;
  uint8_t buf [8];
  double wrote;
  
  fVar1 = random_float();
  buf = (uint8_t  [8])(double)fVar1;
  pack_be_d(&unpack,(double)buf);
  unpack_be_d((double *)&greatest_FMT,&unpack);
  greatest_info.assertions = greatest_info.assertions + 1;
  if (((double)buf != (double)greatest_FMT) || (NAN((double)buf) || NAN((double)greatest_FMT))) {
    fprintf(_stdout,"\nExpected: ");
    fprintf(_stdout,"%f",buf);
    fprintf(_stdout,"\n     Got: ");
    fprintf(_stdout,"%f",greatest_FMT);
    fprintf(_stdout,"\n");
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
    ;
    greatest_info.fail_line = 0x26d;
    greatest_info.msg = "wrote != unpack";
    wrote._4_4_ = GREATEST_TEST_RES_FAIL;
  }
  else {
    greatest_info.msg = (char *)0x0;
    wrote._4_4_ = GREATEST_TEST_RES_PASS;
  }
  return wrote._4_4_;
}

Assistant:

TEST
generic_pack_unpack_be_d_should_match(void) {
    double  wrote = random_float();
    uint8_t buf[sizeof(wrote)];
    pack_be_d(buf, wrote);
    double unpack;
    unpack_be_d(&unpack, buf);
    ASSERT_EQ_FMT(wrote, unpack, "%f");
    PASS();
}